

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O3

double Fra_ImpComputeStateSpaceRatio(Fra_Man_t *p)

{
  uint *puVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Fra_Sml_t *p_00;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  
  pVVar2 = p->pCla->vImps;
  dVar11 = 0.0;
  if ((pVVar2 != (Vec_Int_t *)0x0) && (pVVar2->nSize != 0)) {
    p_00 = Fra_SmlSimulateComb(p->pManAig,0x40,0);
    if (*(int *)&p_00[1].pAig != 0) {
      __assert_fail("pResult[0] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraImp.c"
                    ,0x281,"double Fra_ImpComputeStateSpaceRatio(Fra_Man_t *)");
    }
    pVVar2 = p->pCla->vImps;
    iVar9 = pVVar2->nSize;
    uVar4 = p_00->nWordsTotal;
    uVar5 = (ulong)uVar4;
    if (0 < iVar9) {
      piVar3 = pVVar2->pArray;
      lVar8 = 0;
      do {
        lVar10 = (long)p_00->nWordsPref;
        iVar7 = (int)uVar5;
        if (p_00->nWordsPref < iVar7) {
          uVar4 = piVar3[lVar8];
          do {
            puVar1 = (uint *)((long)&p_00[1].pAig + lVar10 * 4);
            *puVar1 = *puVar1 | ~*(uint *)((long)&p_00[1].pAig +
                                          lVar10 * 4 + (long)(((int)uVar4 >> 0x10) * iVar7) * 4) &
                                *(uint *)((long)&p_00[1].pAig +
                                         lVar10 * 4 + (long)(int)((uVar4 & 0xffff) * iVar7) * 4);
            lVar10 = lVar10 + 1;
            uVar5 = (ulong)p_00->nWordsTotal;
          } while (lVar10 < (long)uVar5);
          iVar9 = pVVar2->nSize;
        }
        uVar4 = (uint)uVar5;
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar9);
    }
    iVar9 = p_00->nWordsPref;
    lVar8 = (long)iVar9;
    dVar11 = 0.0;
    if (iVar9 < (int)uVar4) {
      iVar7 = 0;
      do {
        uVar6 = *(uint *)((long)&p_00[1].pAig + lVar8 * 4);
        uVar6 = (uVar6 >> 1 & 0x55555555) + (uVar6 & 0x55555555);
        uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
        uVar6 = (uVar6 >> 4 & 0x7070707) + (uVar6 & 0x7070707);
        uVar6 = (uVar6 >> 8 & 0xf000f) + (uVar6 & 0xf000f);
        iVar7 = iVar7 + (uVar6 >> 0x10) + (uVar6 & 0xffff);
        lVar8 = lVar8 + 1;
      } while ((int)uVar4 != lVar8);
      dVar11 = (double)iVar7 * 100.0;
    }
    dVar11 = dVar11 / (double)(int)((uVar4 - iVar9) * 0x20);
    Fra_SmlStop(p_00);
  }
  return dVar11;
}

Assistant:

double Fra_ImpComputeStateSpaceRatio( Fra_Man_t * p )
{
    int nSimWords = 64;
    Fra_Sml_t * pComb;
    unsigned * pResult;
    double Ratio = 0.0;
    int Left, Right, Imp, i;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return Ratio;
    // simulate the AIG manager with combinational patterns
    pComb = Fra_SmlSimulateComb( p->pManAig, nSimWords, 0 );
    // go through the implications and collect where they do not hold
    pResult = Fra_ObjSim( pComb, 0 );
    assert( pResult[0] == 0 );
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        Sml_NodeSaveNotImpPatterns( pComb, Left, Right, pResult );
    }
    // count the number of ones in this area
    Ratio = 100.0 * Fra_SmlCountOnesOne( pComb, 0 ) / (32*(pComb->nWordsTotal-pComb->nWordsPref));
    Fra_SmlStop( pComb );
    return Ratio;
}